

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O2

int segdmp_open_read(char **dirs,char *dfn,char *ifn,uint32 *out_n_id,segdmp_type_t *out_data_type,
                    uint32 i_n_stream,uint32 *i_vecsize,uint32 i_blksize)

{
  uint uVar1;
  int32 iVar2;
  FILE *pFVar3;
  uint32 *puVar4;
  uint32 *puVar5;
  char *fmt;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint32 onefrm;
  uint32 swp;
  int local_1078;
  uint32 s;
  segdmp_type_t *local_1070;
  uint32 *local_1068;
  ulong local_1060;
  char **local_1058;
  char *local_1050;
  char *local_1048;
  ulong local_1040;
  char fn [4097];
  
  vecsize = i_vecsize;
  blksize = i_blksize;
  n_seg = (uint32 *)0x0;
  uVar7 = 0xffffffffffffffff;
  do {
    uVar7 = (ulong)((int)uVar7 + 1);
  } while (dirs[uVar7] != (char *)0x0);
  n_stream = i_n_stream;
  local_1070 = out_data_type;
  local_1068 = out_n_id;
  local_1050 = dfn;
  local_1048 = ifn;
  idx_fp = (FILE **)__ckd_calloc__(uVar7,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x189);
  dmp_fp = (FILE **)__ckd_calloc__(uVar7,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x18a);
  dmp_swp = (uint32 *)
            __ckd_calloc__(uVar7,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,0x18b);
  uVar1 = 0;
  local_1060 = uVar7;
  local_1058 = dirs;
  do {
    if ((uint32)local_1060 == uVar1) {
      n_part = (uint32)local_1060;
      *local_1070 = cur_type;
      uVar7 = (ulong)n_id;
      *local_1068 = n_id;
      puVar5 = (uint32 *)
               __ckd_calloc__(uVar7,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                              ,0x1a5);
      puVar4 = id_off;
      id_nxt_off = puVar5;
      for (uVar7 = 0; uVar7 < n_id; uVar7 = uVar7 + 1) {
        puVar5[uVar7] = puVar4[uVar7];
      }
      nxt_seg = (uint32 *)
                __ckd_calloc__((ulong)n_id,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0x1a9);
      return 0;
    }
    sprintf(fn,"%s/%s",dirs[uVar1],local_1048);
    pFVar3 = s3open(fn,"rb",dmp_swp + uVar1);
    idx_fp[uVar1] = pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      fmt = "Unable to open index";
      lVar6 = 0x191;
LAB_00108391:
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                     ,lVar6,fmt);
      goto LAB_00108398;
    }
    iVar2 = bio_fread(&cur_type,4,1,pFVar3,dmp_swp[uVar1],&ignore);
    if (iVar2 != 1) {
      fmt = "unable to read seg idx file";
      lVar6 = 0xc9;
      goto LAB_00108391;
    }
    iVar2 = bio_fread(&n_id,4,1,idx_fp[uVar1],dmp_swp[uVar1],&ignore);
    if (iVar2 != 1) {
      fmt = "Unable to read index file";
      lVar6 = 0xcd;
      goto LAB_00108391;
    }
    iVar2 = bio_fread(&onefrm,4,1,idx_fp[uVar1],dmp_swp[uVar1],&ignore);
    if (iVar2 != 1) {
      fmt = "Unable to read index file";
      lVar6 = 0xd3;
      goto LAB_00108391;
    }
    if ((onefrm == 0) && (n_frame == (uint32 **)0x0)) {
      n_frame = (uint32 **)
                __ckd_calloc__((ulong)n_id,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0xd9);
    }
    if (n_seg == (uint32 *)0x0) {
      n_seg = (uint32 *)
              __ckd_calloc__((ulong)n_id,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                             ,0xdd);
    }
    if (id_part == (uint32 *)0x0) {
      id_part = (uint32 *)
                __ckd_calloc__((ulong)n_id,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0xe1);
      id_off = (uint32 *)
               __ckd_calloc__((ulong)n_id,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                              ,0xe2);
      id_len = (uint32 *)
               __ckd_calloc__((ulong)n_id,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                              ,0xe3);
    }
    iVar2 = bio_fread(&frame_sz,4,1,idx_fp[uVar1],dmp_swp[uVar1],&ignore);
    if (iVar2 != 1) {
      fmt = "Unable to read index file";
      lVar6 = 0xe7;
      goto LAB_00108391;
    }
    iVar2 = bio_fread(&s,4,1,idx_fp[uVar1],dmp_swp[uVar1],&ignore);
    if (iVar2 != 1) {
      fmt = "Unable to read index file";
      lVar6 = 0xed;
      goto LAB_00108391;
    }
    iVar2 = bio_fread(&local_1078,4,1,idx_fp[uVar1],dmp_swp[uVar1],&ignore);
    if (iVar2 != 1) {
      fmt = "Unable to read index file";
      lVar6 = 0xf3;
      goto LAB_00108391;
    }
    local_1040 = (ulong)(local_1078 + s);
    for (uVar7 = (ulong)s; dirs = local_1058, uVar7 < local_1040; uVar7 = uVar7 + 1) {
      id_part[uVar7] = uVar1;
      iVar2 = bio_fread(n_seg + uVar7,4,1,idx_fp[uVar1],dmp_swp[uVar1],&ignore);
      if (iVar2 != 1) {
        fmt = "Unable to read index file";
        lVar6 = 0xfe;
        goto LAB_00108391;
      }
      iVar2 = bio_fread(id_off + uVar7,4,1,idx_fp[uVar1],dmp_swp[uVar1],&ignore);
      if (iVar2 != 1) {
        fmt = "Unable to read index file";
        lVar6 = 0x104;
        goto LAB_00108391;
      }
      if (onefrm == 0) {
        if ((ulong)n_seg[uVar7] == 0) {
          puVar4 = (uint32 *)0x0;
        }
        else {
          puVar4 = (uint32 *)
                   __ckd_calloc__((ulong)n_seg[uVar7],4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                  ,0x10b);
        }
        n_frame[uVar7] = puVar4;
        uVar8 = 0xffffffffffffffff;
        lVar6 = 0;
        while (uVar8 = uVar8 + 1, uVar8 < n_seg[uVar7]) {
          iVar2 = bio_fread((void *)(lVar6 + (long)n_frame[uVar7]),4,1,idx_fp[uVar1],dmp_swp[uVar1],
                            &ignore);
          lVar6 = lVar6 + 4;
          if (iVar2 != 1) {
            fmt = "Unable to read index file";
            lVar6 = 0x113;
            goto LAB_00108391;
          }
        }
      }
      else if (n_frame != (uint32 **)0x0) {
        ckd_free(n_frame);
        n_frame = (uint32 **)0x0;
      }
    }
    sprintf(fn,"%s/%s",local_1058[uVar1],local_1050);
    pFVar3 = s3open(fn,"rb",&swp);
    dmp_fp[uVar1] = pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      fmt = "Unable to open dmp";
      lVar6 = 0x199;
      goto LAB_00108391;
    }
    uVar7 = (ulong)uVar1;
    uVar1 = uVar1 + 1;
  } while (swp == dmp_swp[uVar7]);
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,0x19c,"Dmp and index assumed to have same byte-order, but they don\'t\n");
LAB_00108398:
  exit(1);
}

Assistant:

int
segdmp_open_read(const char **dirs,		/* directories available for dump files */
		 const char *dfn,		/* dump file name */
		 const char *ifn,		/* index file name */
		 uint32 *out_n_id,		/* # of segment id's (i.e. phones, states, etc.)*/
		 segdmp_type_t *out_data_type, /* type of data to store in segment dump */
		 uint32 i_n_stream,
		 uint32* i_vecsize,
		 uint32 i_blksize)	
{
    char fn[MAXPATHLEN+1];
    uint32 n_dir;
    uint32 i, swp;
    uint32 *n_frame;
    
    n_stream = i_n_stream;
    vecsize = i_vecsize;
    blksize = i_blksize;
    
    n_seg = NULL;
    n_frame = NULL;

    for (i = 0; dirs[i]; i++);
    n_dir = i;

    idx_fp = ckd_calloc(n_dir, sizeof(FILE *));
    dmp_fp = ckd_calloc(n_dir, sizeof(FILE *));
    dmp_swp = ckd_calloc(n_dir, sizeof(uint32));

    for (i = 0; i < n_dir; i++) {
	sprintf(fn, "%s/%s", dirs[i], ifn);
	idx_fp[i] = s3open(fn, "rb", &dmp_swp[i]);
	if (idx_fp[i] == NULL) {
	    E_FATAL_SYSTEM("Unable to open index");
	}

	read_idx(i);

	sprintf(fn, "%s/%s", dirs[i], dfn);
	dmp_fp[i] = s3open(fn, "rb", &swp);
	if (dmp_fp[i] == NULL) {
	    E_FATAL_SYSTEM("Unable to open dmp");
	}
	if (swp != dmp_swp[i]) {
	    E_FATAL("Dmp and index assumed to have same byte-order, but they don't\n");
	}
    }

    n_part = n_dir;

    *out_data_type = cur_type;
    *out_n_id = n_id;

    id_nxt_off = ckd_calloc(n_id, sizeof(uint32));
    for (i = 0; i < n_id; i++) {
	id_nxt_off[i] = id_off[i];
    }
    nxt_seg    = ckd_calloc(n_id, sizeof(uint32));

    return S3_SUCCESS;
}